

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTcpConnection.c
# Opt level: O3

void sbfTcpConnection_destroy(sbfTcpConnection_conflict tc)

{
  sbfRefCount *psVar1;
  
  sbfLog_log(tc->mLog,0,"destroying TCP connection %p",tc);
  tc->mDestroyed = 1;
  evutil_closesocket(tc->mSocket);
  if (tc->mEvent != (bufferevent *)0x0) {
    bufferevent_free();
  }
  LOCK();
  psVar1 = &tc->mRefCount;
  psVar1->mRefCount = psVar1->mRefCount - 1;
  UNLOCK();
  if (psVar1->mRefCount == 0) {
    free(tc);
    return;
  }
  return;
}

Assistant:

void
sbfTcpConnection_destroy (sbfTcpConnection tc)
{
    sbfLog_debug (tc->mLog, "destroying TCP connection %p", tc);

    tc->mDestroyed = 1;
    EVUTIL_CLOSESOCKET (tc->mSocket);
    if (tc->mEvent != NULL)
        bufferevent_free (tc->mEvent);

    if (sbfRefCount_decrement (&tc->mRefCount))
        free (tc);
}